

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip::groebnerRow64_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  lVar22 = (long)targetRow;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x2cdc];
  auVar21._8_8_ = 0x8000000000000000;
  auVar21._0_8_ = 0x8000000000000000;
  auVar23 = vxorpd_avx512vl(auVar24,auVar21);
  auVar25._0_8_ =
       auVar23._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d1c];
  auVar25._8_8_ = auVar23._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2cdc] = 0.0;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2da0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x2d60];
  auVar23 = vfmadd213sd_fma(auVar26,auVar25,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2d60] = auVar23._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2de2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2da2];
  auVar23 = vfmadd213sd_fma(auVar27,auVar25,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2da2] = auVar23._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e24];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2de4];
  auVar23 = vfmadd213sd_fma(auVar28,auVar25,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2de4] = auVar23._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e66];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2e26];
  auVar23 = vfmadd213sd_fma(auVar29,auVar25,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2e26] = auVar23._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ea8];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2e68];
  auVar23 = vfmadd213sd_fma(auVar30,auVar25,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2e68] = auVar23._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2eea];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2eaa];
  auVar23 = vfmadd213sd_fma(auVar31,auVar25,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2eaa] = auVar23._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f2c];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2eec];
  auVar23 = vfmadd213sd_fma(auVar32,auVar25,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2eec] = auVar23._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f6e];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2f2e];
  auVar23 = vfmadd213sd_fma(auVar33,auVar25,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2f2e] = auVar23._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fb0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2f70];
  auVar23 = vfmadd213sd_fma(auVar34,auVar25,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2f70] = auVar23._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ff2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar22 + 0x2fb2];
  auVar23 = vfmadd213sd_fma(auVar35,auVar25,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2fb2] = auVar23._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3034];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x2ff4];
  auVar23 = vfmadd213sd_fma(auVar36,auVar25,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x2ff4] = auVar23._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3076];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3036];
  auVar23 = vfmadd213sd_fma(auVar37,auVar25,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3036] = auVar23._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30b8];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3078];
  auVar23 = vfmadd213sd_fma(auVar38,auVar25,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3078] = auVar23._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30fa];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x30ba];
  auVar23 = vfmadd213sd_fma(auVar39,auVar25,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x30ba] = auVar23._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x313c];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x30fc];
  auVar23 = vfmadd213sd_fma(auVar40,auVar25,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x30fc] = auVar23._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x317e];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x313e];
  auVar23 = vfmadd213sd_fma(auVar41,auVar25,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x313e] = auVar23._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31c0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3180];
  auVar23 = vfmadd213sd_fma(auVar42,auVar25,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3180] = auVar23._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3202];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x31c2];
  auVar23 = vfmadd213sd_fma(auVar43,auVar25,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x31c2] = auVar23._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3244];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3204];
  auVar23 = vfmadd213sd_fma(auVar44,auVar25,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3204] = auVar23._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3286];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3246];
  auVar23 = vfmadd213sd_fma(auVar45,auVar25,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3246] = auVar23._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[13000];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar22 + 0x3288];
  auVar23 = vfmadd213sd_fma(auVar46,auVar25,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar22 + 0x3288] = auVar23._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow64_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,174) / groebnerMatrix(64,174);
  groebnerMatrix(targetRow,174) = 0.0;
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(64,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(64,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(64,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(64,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(64,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(64,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(64,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(64,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(64,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(64,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(64,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(64,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(64,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(64,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(64,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(64,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(64,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(64,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(64,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(64,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(64,196);
}